

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkMessage
          (DescriptorBuilder *this,Descriptor *message,DescriptorProto *proto)

{
  long lVar1;
  int iVar2;
  MessageOptions *pMVar3;
  DescriptorProto *proto_00;
  EnumDescriptorProto *proto_01;
  FieldDescriptorProto *pFVar4;
  int local_30;
  int local_2c;
  int i_3;
  int i_2;
  int i_1;
  int i;
  DescriptorProto *proto_local;
  Descriptor *message_local;
  DescriptorBuilder *this_local;
  
  if (*(long *)(message + 0x20) == 0) {
    pMVar3 = MessageOptions::default_instance();
    *(MessageOptions **)(message + 0x20) = pMVar3;
  }
  i_2 = 0;
  while( true ) {
    iVar2 = Descriptor::nested_type_count(message);
    if (iVar2 <= i_2) break;
    lVar1 = *(long *)(message + 0x40);
    proto_00 = DescriptorProto::nested_type(proto,i_2);
    CrossLinkMessage(this,(Descriptor *)(lVar1 + (long)i_2 * 0x78),proto_00);
    i_2 = i_2 + 1;
  }
  i_3 = 0;
  while( true ) {
    iVar2 = Descriptor::enum_type_count(message);
    if (iVar2 <= i_3) break;
    lVar1 = *(long *)(message + 0x50);
    proto_01 = DescriptorProto::enum_type(proto,i_3);
    CrossLinkEnum(this,(EnumDescriptor *)(lVar1 + (long)i_3 * 0x38),proto_01);
    i_3 = i_3 + 1;
  }
  local_2c = 0;
  while( true ) {
    iVar2 = Descriptor::field_count(message);
    if (iVar2 <= local_2c) break;
    lVar1 = *(long *)(message + 0x30);
    pFVar4 = DescriptorProto::field(proto,local_2c);
    CrossLinkField(this,(FieldDescriptor *)(lVar1 + (long)local_2c * 0x78),pFVar4);
    local_2c = local_2c + 1;
  }
  local_30 = 0;
  while( true ) {
    iVar2 = Descriptor::extension_count(message);
    if (iVar2 <= local_30) break;
    lVar1 = *(long *)(message + 0x70);
    pFVar4 = DescriptorProto::extension(proto,local_30);
    CrossLinkField(this,(FieldDescriptor *)(lVar1 + (long)local_30 * 0x78),pFVar4);
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkMessage(
    Descriptor* message, const DescriptorProto& proto) {
  if (message->options_ == NULL) {
    message->options_ = &MessageOptions::default_instance();
  }

  for (int i = 0; i < message->nested_type_count(); i++) {
    CrossLinkMessage(&message->nested_types_[i], proto.nested_type(i));
  }

  for (int i = 0; i < message->enum_type_count(); i++) {
    CrossLinkEnum(&message->enum_types_[i], proto.enum_type(i));
  }

  for (int i = 0; i < message->field_count(); i++) {
    CrossLinkField(&message->fields_[i], proto.field(i));
  }

  for (int i = 0; i < message->extension_count(); i++) {
    CrossLinkField(&message->extensions_[i], proto.extension(i));
  }
}